

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

int arkode_butcher_order6c
              (sunrealtype *b,sunrealtype *c1,sunrealtype **A1,sunrealtype *c2,sunrealtype **A2,
              sunrealtype *c3,int s)

{
  int iVar1;
  sunrealtype *b_00;
  sunrealtype *b_01;
  void *__ptr;
  ulong uVar2;
  ulong uVar3;
  size_t __nmemb;
  double dVar4;
  
  __nmemb = (size_t)s;
  b_00 = (sunrealtype *)calloc(__nmemb,8);
  b_01 = (sunrealtype *)calloc(__nmemb,8);
  __ptr = calloc(__nmemb,8);
  iVar1 = arkode_butcher_mv(A2,c3,s,b_00);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_mv(A1,c2,s,b_01), iVar1 == 0)) && (0 < s)) &&
     (((b_00 != (sunrealtype *)0x0 && (b_01 != (sunrealtype *)0x0)) && (__ptr != (void *)0x0)))) {
    uVar2 = (ulong)(uint)s;
    uVar3 = 0;
    do {
      *(double *)((long)__ptr + uVar3 * 8) = b_00[uVar3] * b_01[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar2 != uVar3);
    if (c1 != (sunrealtype *)0x0) {
      uVar3 = 0;
      do {
        b_00[uVar3] = c1[uVar3] * *(double *)((long)__ptr + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      if (b == (sunrealtype *)0x0) {
        return 0;
      }
      dVar4 = 0.0;
      uVar3 = 0;
      do {
        dVar4 = dVar4 + b[uVar3] * b_00[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      free(b_00);
      free(b_01);
      free(__ptr);
      return (uint)(ABS(dVar4 + -0.041666666666666664) <= 1.4901161193847656e-08);
    }
  }
  free(b_00);
  free(b_01);
  free(__ptr);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6c(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype** A1, sunrealtype* c2,
                                             sunrealtype** A2, sunrealtype* c3,
                                             int s)
{
  sunrealtype bcAc2;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp3 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_mv(A2, c3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_mv(A1, c2, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(tmp1, tmp2, s, tmp3))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c1, tmp3, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    free(tmp3);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp1, s, &bcAc2)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  free(tmp3);
  return (SUNRabs(bcAc2 - SUN_RCONST(1.0) / SUN_RCONST(24.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}